

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O3

const_iterator __thiscall
frozen::
set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
::find<std::basic_string_view<char,std::char_traits<char>>>
          (set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
           *this,basic_string_view<char,_std::char_traits<char>_> *key)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  _Cat _Var1;
  const_iterator pvVar2;
  
  pvVar2 = lower_bound<std::basic_string_view<char,std::char_traits<char>>>(this,key);
  if ((pvVar2 != (const_iterator)(this + 0x58)) &&
     (__x._M_len = key->_M_len, __x._M_str = key->_M_str, __y._M_len = pvVar2->_M_len,
     __y._M_str = pvVar2->_M_str, _Var1 = std::operator<=><char,std::char_traits<char>>(__x,__y),
     -1 < _Var1._M_value)) {
    return pvVar2;
  }
  return (const_iterator)(this + 0x58);
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    const_iterator where = lower_bound(key);
    if ((where != end()) && !less_than_(key, *where))
      return where;
    else
      return end();
  }